

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapInsertNode(jx9_hashmap *pMap,jx9_hashmap_node *pNode,int bPreserve)

{
  jx9_value *pValue;
  sxi32 local_34;
  sxi32 rc;
  jx9_value *pObj;
  int bPreserve_local;
  jx9_hashmap_node *pNode_local;
  jx9_hashmap *pMap_local;
  
  pValue = HashmapExtractNodeValue(pNode);
  if (pValue == (jx9_value *)0x0) {
    pMap_local._4_4_ = -3;
  }
  else {
    if (pNode->iType == 1) {
      if (bPreserve == 0) {
        local_34 = HashmapInsert(pMap,(jx9_value *)0x0,pValue);
      }
      else {
        local_34 = HashmapInsertIntKey(pMap,(pNode->xKey).iKey,pValue);
      }
    }
    else {
      local_34 = HashmapInsertBlobKey(pMap,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,pValue)
      ;
    }
    pMap_local._4_4_ = local_34;
  }
  return pMap_local._4_4_;
}

Assistant:

static sxi32 HashmapInsertNode(jx9_hashmap *pMap, jx9_hashmap_node *pNode, int bPreserve)
{
	jx9_value *pObj;
	sxi32 rc;
	/* Extract the node value */
	pObj = HashmapExtractNodeValue(&(*pNode));
	if( pObj == 0 ){
		return SXERR_EMPTY;
	}
	/* Preserve key */
	if( pNode->iType == HASHMAP_INT_NODE){
		/* Int64 key */
		if( !bPreserve ){
			/* Assign an automatic index */
			rc = HashmapInsert(&(*pMap), 0, pObj);
		}else{
			rc = HashmapInsertIntKey(&(*pMap), pNode->xKey.iKey, pObj);
		}
	}else{
		/* Blob key */
		rc = HashmapInsertBlobKey(&(*pMap), SyBlobData(&pNode->xKey.sKey), 
			SyBlobLength(&pNode->xKey.sKey), pObj);
	}
	return rc;
}